

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

bool __thiscall cmELF::GetSOName(cmELF *this,string *soname)

{
  _Head_base<0UL,_cmELFInternal_*,_false> _Var1;
  long lVar2;
  
  _Var1._M_head_impl =
       (this->Internal)._M_t.
       super___uniq_ptr_impl<cmELFInternal,_std::default_delete<cmELFInternal>_>._M_t.
       super__Tuple_impl<0UL,_cmELFInternal_*,_std::default_delete<cmELFInternal>_>.
       super__Head_base<0UL,_cmELFInternal_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl == (cmELFInternal *)0x0) ||
     ((_Var1._M_head_impl)->ELFType != FileTypeSharedLibrary)) {
    lVar2 = 0;
  }
  else {
    lVar2 = (**(code **)((long)(_Var1._M_head_impl)->_vptr_cmELFInternal + 0x30))
                      (_Var1._M_head_impl,0xe);
  }
  if (lVar2 != 0) {
    std::__cxx11::string::_M_assign((string *)soname);
  }
  return lVar2 != 0;
}

Assistant:

bool cmELF::GetSOName(std::string& soname)
{
  if (StringEntry const* se = this->GetSOName()) {
    soname = se->Value;
    return true;
  }
  return false;
}